

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O2

size_t __thiscall henson::Scheduler::find_available_procs(Scheduler *this,size_t num_procs)

{
  ulong uVar1;
  size_t sVar2;
  ulong __n;
  reference rVar3;
  
  __n = 1;
  sVar2 = 0;
  do {
    uVar1 = (ulong)(this->available_procs_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
            ((long)(this->available_procs_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
            (long)(this->available_procs_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
    if (uVar1 <= __n) {
      return uVar1;
    }
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->available_procs_,__n);
    sVar2 = sVar2 + 1;
    if ((rVar3._M_mask & *rVar3._M_p) == 0) {
      sVar2 = 0;
    }
    __n = __n + 1;
  } while (sVar2 != num_procs);
  return __n - num_procs;
}

Assistant:

size_t  find_available_procs(size_t num_procs)
        {
            size_t procs = 0;
            for(size_t i = 1; i < available_procs_.size(); ++i)
            {
                if (available_procs_[i])
                    procs++;
                else
                    procs = 0;

                if (procs == num_procs)
                    return i - (procs - 1);
            }

            return available_procs_.size();
        }